

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t
exr_attr_string_set_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *d,int32_t len)

{
  int iVar1;
  int in_ECX;
  exr_attr_string_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  char *sstr;
  exr_attr_string_t *in_stack_ffffffffffffffd0;
  char *__dest;
  undefined4 in_stack_ffffffffffffffd8;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI == (exr_context_t)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid string argument to string set");
  }
  else if (in_ECX < 0) {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,3,"Received request to assign a negative sized string (%d)",in_ECX);
  }
  else {
    iVar1._0_1_ = in_RSI->has_nonimage_data;
    iVar1._1_1_ = in_RSI->is_multipart;
    iVar1._2_1_ = in_RSI->strict_header;
    iVar1._3_1_ = in_RSI->silent_header;
    if (in_ECX < iVar1) {
      in_RSI->mode = (char)in_ECX;
      in_RSI->version = (char)((uint)in_ECX >> 8);
      in_RSI->max_name_length = (char)((uint)in_ECX >> 0x10);
      in_RSI->is_singlepart_tiled = (char)((uint)in_ECX >> 0x18);
      __dest = *(char **)&in_RSI->filename;
      if (0 < in_ECX) {
        if (in_RDX == (exr_attr_string_t *)0x0) {
          memset(__dest,0,(long)in_ECX);
        }
        else {
          strncpy(__dest,(char *)in_RDX,(long)in_ECX);
        }
      }
      __dest[in_ECX] = '\0';
      local_4 = 0;
    }
    else {
      exr_attr_string_destroy
                ((exr_context_t)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0
                );
      local_4 = exr_attr_string_create_with_length
                          (in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           (int32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_set_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* d, int32_t len)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!s)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string argument to string set");

    if (len < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to assign a negative sized string (%d)",
            len);

    if (s->alloc_size > len)
    {
        /* we own the memory */
        char* sstr;

        s->length = len;
        sstr      = EXR_CONST_CAST (char*, s->str);
        if (len > 0)
        {
#ifdef _MSC_VER
#    pragma warning(push)
#    pragma warning(disable : 4996)
#elif defined(__GNUC__)
#    pragma GCC diagnostic push
#    pragma GCC diagnostic ignored "-Wstringop-truncation"
#endif
            if (d)
                strncpy (sstr, d, (size_t) len);
            else
                memset (sstr, 0, (size_t) len);
#ifdef _MSC_VER
#    pragma warning(pop)
#elif defined(__GNUC__)
#    pragma GCC diagnostic pop
#endif
        }
        sstr[len] = '\0';
        return EXR_ERR_SUCCESS;
    }
    exr_attr_string_destroy (ctxt, s);
    return exr_attr_string_create_with_length (ctxt, s, d, len);
}